

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

NeuralNetworkPreprocessing *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::NeuralNetworkPreprocessing>
          (Arena *arena)

{
  NeuralNetworkPreprocessing *this;
  
  if (arena == (Arena *)0x0) {
    this = (NeuralNetworkPreprocessing *)operator_new(0x28);
    CoreML::Specification::NeuralNetworkPreprocessing::NeuralNetworkPreprocessing
              (this,(Arena *)0x0,false);
  }
  else {
    this = (NeuralNetworkPreprocessing *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::NeuralNetworkPreprocessing::typeinfo);
    CoreML::Specification::NeuralNetworkPreprocessing::NeuralNetworkPreprocessing(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }